

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

int match_oplist(int op,...)

{
  int iVar1;
  bool local_101;
  int *local_100;
  int local_e8 [48];
  uint local_28;
  int nextop;
  va_list args;
  int op_local;
  
  args[0]._0_8_ = &stack0x00000008;
  local_28 = 8;
  do {
    if (local_28 < 0x29) {
      local_100 = (int *)((long)local_e8 + (long)(int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_100 = (int *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    iVar1 = *local_100;
    local_101 = iVar1 != 0 && iVar1 != op;
  } while (local_101);
  return (int)(iVar1 != 0);
}

Assistant:

static int match_oplist(int op, ...)
{
	va_list args;
	int nextop;

	va_start(args, op);
	do {
		nextop = va_arg(args, int);
	} while (nextop != 0 && nextop != op);
	va_end(args);

	return nextop != 0;
}